

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom3d.c
# Opt level: O1

point3d * v3rotate(point3d *p,double theta,point3d *a,point3d *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  vector3d axis;
  point3d q;
  matrix4 rotmat;
  vector3d local_d8;
  double local_c0;
  point3d local_b8;
  matrix4 local_a0;
  
  dVar2 = b->x - a->x;
  dVar3 = b->y - a->y;
  local_d8.z = b->z - a->z;
  dVar1 = local_d8.z * local_d8.z + dVar2 * dVar2 + dVar3 * dVar3;
  local_d8.x = dVar2;
  local_d8.y = dVar3;
  if (dVar1 < 0.0) {
    local_c0 = local_d8.z;
    dVar1 = sqrt(dVar1);
    dVar4 = local_c0;
  }
  else {
    dVar1 = SQRT(dVar1);
    dVar4 = local_d8.z;
  }
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    local_d8.x = dVar2 / dVar1;
    local_d8.y = dVar3 / dVar1;
    local_d8.z = dVar4 / dVar1;
  }
  v3rotationMat(&local_d8,theta,&local_a0);
  dVar1 = b->x;
  local_b8.x = p->x - dVar1;
  dVar2 = b->y;
  local_b8.y = p->y - dVar2;
  dVar3 = b->z;
  local_b8.z = p->z - dVar3;
  v3mulPointMat(&local_b8,&local_a0);
  p->x = dVar1 + local_b8.x;
  p->y = dVar2 + local_b8.y;
  p->z = dVar3 + local_b8.z;
  return p;
}

Assistant:

point3d*  v3rotate(point3d* p, double theta, point3d* a, point3d* b) {
	vector3d axis;
	point3d  q;
	matrix4  rotmat;

	v3makeVec(b, a, &axis);
	v3rotationMat(&axis, theta, &rotmat);

	v3sub(p, b, &q);
	v3mulPointMat(&q, &rotmat);
	v3add(&q, b, p);

	return(p);
}